

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_char_ready_p(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  sexp psVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sexp psVar5;
  
  if ((((ulong)in & 3) != 0) || (in->tag != 0x10)) {
    psVar5 = sexp_type_exception(ctx,self,0x10,in);
    return psVar5;
  }
  psVar5 = (sexp)&DAT_0000003e;
  if ((in->value).flonum_bits[0x28] != '\0') {
    if ((in->value).type.setters == (sexp)0x0) {
      psVar5 = (in->value).type.slots;
    }
    else {
      if ((in->value).type.print < (sexp)(in->value).port.size) {
        return (sexp)&DAT_0000013e;
      }
      psVar5 = (in->value).type.slots;
      if (((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x12)) &&
         ((in->value).type.getters == (sexp)0x0)) {
        return (sexp)&DAT_0000013e;
      }
    }
    if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x12)) {
      psVar1 = (in->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        iVar2 = (psVar5->value).promise.donep;
      }
      else {
        iVar2 = fileno((FILE *)psVar1);
      }
      iVar2 = sexp_fileno_ready_p(iVar2);
      psVar5 = (sexp)((ulong)(iVar2 != 0) << 8 | 0x3e);
    }
    else {
      psVar1 = (in->value).type.getters;
      psVar5 = (sexp)&DAT_0000013e;
      if (psVar1 != (sexp)0x0) {
        iVar2 = fileno((FILE *)psVar1);
        uVar3 = fcntl(iVar2,3);
        if ((uVar3 >> 0xb & 1) == 0) {
          iVar2 = fileno((FILE *)psVar1);
          fcntl(iVar2,4,0);
          iVar2 = getc((FILE *)psVar1);
          iVar4 = fileno((FILE *)psVar1);
          fcntl(iVar4,4,(ulong)uVar3);
        }
        else {
          iVar2 = getc((FILE *)psVar1);
        }
        if ((iVar2 == -1) || (iVar4 = ferror((FILE *)psVar1), iVar4 != 0)) {
          clearerr((FILE *)psVar1);
          psVar5 = (sexp)&DAT_0000003e;
        }
        else {
          ungetc(iVar2,(FILE *)psVar1);
        }
      }
    }
  }
  return psVar5;
}

Assistant:

sexp sexp_char_ready_p (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  if (!sexp_port_openp(in))
    return SEXP_FALSE;
  if (sexp_port_buf(in))
    if (sexp_port_offset(in) < sexp_port_size(in)
        || (!sexp_filenop(sexp_port_fd(in)) && !sexp_port_stream(in)))
      return SEXP_TRUE;
#if SEXP_USE_GREEN_THREADS     /* maybe not just when threads are enabled */
  if (sexp_filenop(sexp_port_fd(in)))
    return sexp_make_boolean(sexp_fileno_ready_p(sexp_port_fileno(in)));
  else if (sexp_port_stream(in))
    return sexp_make_boolean(sexp_stream_ready_p(sexp_port_stream(in)));
#endif
  /* for custom ports and unthreaded compiles we just return true for now */
  return SEXP_TRUE;
}